

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptorTables::AddEnumValueByNumber
          (FileDescriptorTables *this,EnumValueDescriptor *value)

{
  int iVar1;
  EnumDescriptor *pEVar2;
  undefined1 uVar3;
  EnumValueDescriptor *local_28;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool>
  local_20;
  
  pEVar2 = value->type_;
  local_28 = value;
  if (0 < pEVar2->value_count_) {
    iVar1 = pEVar2->values_->number_;
    if ((value->number_ < iVar1) ||
       (uVar3 = 1, (long)pEVar2->sequential_value_limit_ + (long)iVar1 < (long)value->number_)) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ::insert<google::protobuf::EnumValueDescriptor_*,_0>
                (&local_20,
                 &(this->enum_values_by_number_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 ,&local_28);
      uVar3 = local_20.second;
    }
    return (bool)uVar3;
  }
  AddEnumValueByNumber();
}

Assistant:

bool FileDescriptorTables::AddEnumValueByNumber(EnumValueDescriptor* value) {
  // Skip values that are at the start of the sequence.
  const int base = value->type()->value(0)->number();
  if (base <= value->number() &&
      value->number() <=
          static_cast<int64_t>(base) + value->type()->sequential_value_limit_)
    return true;
  return enum_values_by_number_.insert(value).second;
}